

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetTargetPropertyCommand.cxx
# Opt level: O2

bool __thiscall
cmGetTargetPropertyCommand::InitialPass
          (cmGetTargetPropertyCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  string *name;
  string *__lhs;
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  TargetType tgtType;
  cmTarget *this_00;
  cmMessenger *messenger;
  char *pcVar4;
  ostream *poVar5;
  PolicyID id;
  MessageType t;
  string sStack_1e8;
  string prop;
  cmListFileBacktrace bt;
  
  __lhs = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)__lhs != 0x60) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&bt,"called with incorrect number of arguments",(allocator<char> *)&prop);
    cmCommand::SetError(&this->super_cmCommand,(string *)&bt);
    std::__cxx11::string::~string((string *)&bt);
    return false;
  }
  prop._M_dataplus._M_p = (pointer)&prop.field_2;
  prop._M_string_length = 0;
  name = __lhs + 1;
  prop.field_2._M_local_buf[0] = '\0';
  this_00 = cmMakefile::FindTargetToUse((this->super_cmCommand).Makefile,name,false);
  if (this_00 == (cmTarget *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&bt);
    PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0045,false);
    if (PVar3 - NEW < 3) {
      t = FATAL_ERROR;
      bVar2 = true;
LAB_001eb13a:
      poVar5 = std::operator<<((ostream *)&bt,
                               "get_target_property() called with non-existent target \"");
      poVar5 = std::operator<<(poVar5,(string *)name);
      std::operator<<(poVar5,"\".");
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,t,&sStack_1e8);
      std::__cxx11::string::~string((string *)&sStack_1e8);
      if (bVar2) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bt);
        bVar2 = false;
        goto LAB_001eb1e9;
      }
    }
    else if (PVar3 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&sStack_1e8,(cmPolicies *)0x2d,id);
      poVar5 = std::operator<<((ostream *)&bt,(string *)&sStack_1e8);
      std::operator<<(poVar5,"\n");
      std::__cxx11::string::~string((string *)&sStack_1e8);
      bVar2 = false;
      t = AUTHOR_WARNING;
      goto LAB_001eb13a;
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&bt);
  }
  else {
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 2,"ALIASED_TARGET");
    if (bVar2) {
      bVar2 = cmMakefile::IsAlias((this->super_cmCommand).Makefile,name);
      if (bVar2) {
        cmTarget::GetName_abi_cxx11_(this_00);
        std::__cxx11::string::_M_assign((string *)&prop);
LAB_001eb0e4:
        bVar2 = true;
        cmMakefile::AddDefinition((this->super_cmCommand).Makefile,__lhs,prop._M_dataplus._M_p);
        goto LAB_001eb1e9;
      }
    }
    else if ((args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start[2]._M_string_length != 0) {
      cmMakefile::GetBacktrace((cmMakefile *)&bt);
      messenger = cmMakefile::GetMessenger((this->super_cmCommand).Makefile);
      tgtType = cmTarget::GetType(this_00);
      bVar2 = cmTargetPropertyComputer::PassesWhitelist
                        (tgtType,(args->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start + 2,messenger,&bt);
      if ((bVar2) &&
         ((pcVar4 = cmTarget::GetComputedProperty
                              (this_00,(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 2,messenger,&bt)
          , pcVar4 != (char *)0x0 ||
          (pcVar4 = cmTarget::GetProperty
                              (this_00,(args->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 2),
          pcVar4 != (char *)0x0)))) {
        std::__cxx11::string::assign((char *)&prop);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&bt.TopEntry.
                    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
        goto LAB_001eb0e4;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&bt.TopEntry.
                  super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bt,__lhs,
                 "-NOTFOUND");
  cmMakefile::AddDefinition
            (pcVar1,__lhs,
             (char *)bt.TopEntry.
                     super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  std::__cxx11::string::~string((string *)&bt);
  bVar2 = true;
LAB_001eb1e9:
  std::__cxx11::string::~string((string *)&prop);
  return bVar2;
}

Assistant:

bool cmGetTargetPropertyCommand::InitialPass(
  std::vector<std::string> const& args, cmExecutionStatus&)
{
  if (args.size() != 3) {
    this->SetError("called with incorrect number of arguments");
    return false;
  }
  std::string const& var = args[0];
  std::string const& targetName = args[1];
  std::string prop;
  bool prop_exists = false;

  if (cmTarget* tgt = this->Makefile->FindTargetToUse(targetName)) {
    if (args[2] == "ALIASED_TARGET") {
      if (this->Makefile->IsAlias(targetName)) {
        prop = tgt->GetName();
        prop_exists = true;
      }
    } else if (!args[2].empty()) {
      const char* prop_cstr = nullptr;
      cmListFileBacktrace bt = this->Makefile->GetBacktrace();
      cmMessenger* messenger = this->Makefile->GetMessenger();
      if (cmTargetPropertyComputer::PassesWhitelist(tgt->GetType(), args[2],
                                                    messenger, bt)) {
        prop_cstr = tgt->GetComputedProperty(args[2], messenger, bt);
        if (!prop_cstr) {
          prop_cstr = tgt->GetProperty(args[2]);
        }
      }
      if (prop_cstr) {
        prop = prop_cstr;
        prop_exists = true;
      }
    }
  } else {
    bool issueMessage = false;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0045)) {
      case cmPolicies::WARN:
        issueMessage = true;
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0045) << "\n";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        issueMessage = true;
        messageType = MessageType::FATAL_ERROR;
    }
    if (issueMessage) {
      e << "get_target_property() called with non-existent target \""
        << targetName << "\".";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
  }
  if (prop_exists) {
    this->Makefile->AddDefinition(var, prop.c_str());
    return true;
  }
  this->Makefile->AddDefinition(var, (var + "-NOTFOUND").c_str());
  return true;
}